

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UartSerial.cpp
# Opt level: O2

void __thiscall serial_wiring::UartSerial::begin(UartSerial *this,size_t speed_,size_t config_)

{
  tcflag_t tVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  speed_t sStack_30;
  
  if (speed_ == 0x1c200) {
    sStack_30 = 0x1002;
LAB_0010296d:
    bVar2 = false;
  }
  else {
    if (speed_ == 600) {
      sStack_30 = 8;
      goto LAB_0010296d;
    }
    if (speed_ == 0x4b0) {
      sStack_30 = 9;
      goto LAB_0010296d;
    }
    if (speed_ == 0x960) {
      sStack_30 = 0xb;
      goto LAB_0010296d;
    }
    if (speed_ == 0x12c0) {
      sStack_30 = 0xc;
      goto LAB_0010296d;
    }
    if (speed_ == 0x2580) {
      sStack_30 = 0xd;
      goto LAB_0010296d;
    }
    if (speed_ == 0x4b00) {
      sStack_30 = 0xe;
      goto LAB_0010296d;
    }
    if (speed_ == 0x9600) {
      sStack_30 = 0xf;
      goto LAB_0010296d;
    }
    if (speed_ == 0xe100) {
      sStack_30 = 0x1001;
      goto LAB_0010296d;
    }
    if (speed_ == 300) {
      sStack_30 = 7;
      goto LAB_0010296d;
    }
    sStack_30 = 0;
    bVar2 = true;
  }
  uVar4 = config_ << 0x38 | config_ >> 8;
  if ((uVar4 < 0x38) && ((0xff000000ff00ffU >> (config_ >> 8 & 0x3f) & 1) != 0)) {
    if (!bVar2) {
      tVar1 = *(tcflag_t *)(&DAT_001035fc + uVar4 * 4);
      iVar3 = open(this->_serial_device_path,0x102);
      this->_serial_file_descriptor = iVar3;
      if (iVar3 < 0) {
        pcVar5 = this->_serial_device_path;
      }
      else {
        iVar3 = isatty(iVar3);
        if (iVar3 == 0) {
          pcVar5 = "UartSerial::begin - File descriptor is not a TTY device";
        }
        else {
          iVar3 = tcgetattr(this->_serial_file_descriptor,(termios *)&this->_tio_config_original);
          if (iVar3 == 0) {
            iVar3 = tcflush(this->_serial_file_descriptor,2);
            if (iVar3 == 0) {
              (this->_tio_config).c_cflag = tVar1;
              (this->_tio_config).c_cc[5] = '\0';
              (this->_tio_config).c_cc[6] = '\0';
              iVar3 = cfsetspeed((termios *)&this->_tio_config,sStack_30);
              if (iVar3 == 0) {
                iVar3 = tcsetattr(this->_serial_file_descriptor,0,(termios *)&this->_tio_config);
                if (iVar3 == 0) {
                  return;
                }
                pcVar5 = "UartSerial::begin - Unable to set term attributes";
              }
              else {
                pcVar5 = "UartSerial::begin - Unable to set baud rate";
              }
            }
            else {
              pcVar5 = "UartSerial::begin - Unable to flush file descriptor";
            }
          }
          else {
            pcVar5 = "UartSerial::begin - Unable to save current term attributes";
          }
        }
        perror(pcVar5);
        iVar3 = cleanupSerialFileDescriptor(this);
        if (iVar3 == 0) {
          return;
        }
        pcVar5 = "UartSerial::begin - Unable to close serial file descriptor";
      }
      goto LAB_00102a34;
    }
  }
  else if (!bVar2) {
    pcVar5 = "UartSerial::begin - Unsupported configuration";
    goto LAB_00102a34;
  }
  pcVar5 = "UartSerial::begin - Unsupported baud rate";
LAB_00102a34:
  perror(pcVar5);
  return;
}

Assistant:

void
UartSerial::begin (
    const size_t speed_,
    const size_t config_
) {
    // Scrubbed parameters
    speed_t baud_rate = B0;
    size_t c_cflags = 0;

    // Interpret common baud rates
    switch (speed_) {
      case 300: baud_rate = B300; break;
      case 600: baud_rate = B600; break;
      case 1200: baud_rate = B1200; break;
      case 2400: baud_rate = B2400; break;
      case 4800: baud_rate = B4800; break;
      case 9600: baud_rate = B9600; break;
      case 14400: break;
      case 19200: baud_rate = B19200; break;
      case 28800: break;
      case 38400: baud_rate = B38400; break;
      case 57600: baud_rate = B57600; break;
      case 115200: baud_rate = B115200; break;
      default: break;
    }

    // Initialize the value for c_cflag with the options needed for the
    // character size, parity and stop bits.
    switch (config_) {
      case wiring::SERIAL_5E1: c_cflags = (CS5|PARENB); break;
      case wiring::SERIAL_5E2: c_cflags = (CS5|PARENB|CSTOPB); break;
      case wiring::SERIAL_5N1: c_cflags = CS5; break;
      case wiring::SERIAL_5N2: c_cflags = (CS5|CSTOPB); break;
      case wiring::SERIAL_5O1: c_cflags = (CS5|PARENB|PARODD); break;
      case wiring::SERIAL_5O2: c_cflags = (CS5|PARENB|PARODD|CSTOPB); break;
      case wiring::SERIAL_6E1: c_cflags = (CS6|PARENB); break;
      case wiring::SERIAL_6E2: c_cflags = (CS6|PARENB|CSTOPB); break;
      case wiring::SERIAL_6N1: c_cflags = CS6; break;
      case wiring::SERIAL_6N2: c_cflags = (CS6|CSTOPB); break;
      case wiring::SERIAL_6O1: c_cflags = (CS6|PARENB|PARODD); break;
      case wiring::SERIAL_6O2: c_cflags = (CS6|PARENB|PARODD|CSTOPB); break;
      case wiring::SERIAL_7E1: c_cflags = (CS7|PARENB); break;
      case wiring::SERIAL_7E2: c_cflags = (CS7|PARENB|CSTOPB); break;
      case wiring::SERIAL_7N1: c_cflags = CS7; break;
      case wiring::SERIAL_7N2: c_cflags = (CS7|CSTOPB); break;
      case wiring::SERIAL_7O1: c_cflags = (CS7|PARENB|PARODD); break;
      case wiring::SERIAL_7O2: c_cflags = (CS7|PARENB|PARODD|CSTOPB); break;
      case wiring::SERIAL_8E1: c_cflags = (CS8|PARENB); break;
      case wiring::SERIAL_8E2: c_cflags = (CS8|PARENB|CSTOPB); break;
      case wiring::SERIAL_8N1: c_cflags = CS8; break;
      case wiring::SERIAL_8N2: c_cflags = (CS8|CSTOPB); break;
      case wiring::SERIAL_8O1: c_cflags = (CS8|PARENB|PARODD); break;
      case wiring::SERIAL_8O2: c_cflags = (CS8|PARENB|PARODD|CSTOPB); break;
      default: c_cflags = SERIAL_CONFIG_INVALID; break;
    }

    // Validate baud rate
    if ( B0 == baud_rate ) {
        ::perror("UartSerial::begin - Unsupported baud rate");
    // Validate configuration flags
    } else if ( SERIAL_CONFIG_INVALID == c_cflags ) {
        ::perror("UartSerial::begin - Unsupported configuration");
    // Attempt to open the device
    } else if ( 0 > (_serial_file_descriptor = ::open(_serial_device_path, (O_RDWR|O_NOCTTY))) ) {
        ::perror(_serial_device_path);
    // Confirm file descriptor is a TTY device
    } else if ( 0 == ::isatty(_serial_file_descriptor) ) {
        ::perror("UartSerial::begin - File descriptor is not a TTY device");
        if ( 0 != cleanupSerialFileDescriptor() ) {
            ::perror("UartSerial::begin - Unable to close serial file descriptor");
        }
    // Save current device settings
    } else if ( 0 != ::tcgetattr(_serial_file_descriptor, &_tio_config_original) ) {
        ::perror("UartSerial::begin - Unable to save current term attributes");
        if ( 0 != cleanupSerialFileDescriptor() ) {
          ::perror("UartSerial::begin - Unable to close serial file descriptor");
        }
    // Flush all current i/o data before enabling the new configuration
    } else if ( 0 != ::tcflush(_serial_file_descriptor, TCIOFLUSH) ) {
        ::perror("UartSerial::begin - Unable to flush file descriptor");
        if ( 0 != cleanupSerialFileDescriptor() ) {
            ::perror("UartSerial::begin - Unable to close serial file descriptor");
        }
    } else {
        // Configure the termios structure. See termios man page for further info
        // http://man7.org/linux/man-pages/man3/termios.3.html

        // c_iflag - input modes
        // Leave all input flags unset

        // c_oflag - output modes
        // Leave all output flags unset

        // c_cflag - control modes
        _tio_config.c_cflag = c_cflags;
        _tio_config.c_cflag |= CREAD;   // Enable receiver
        _tio_config.c_cflag |= CLOCAL;  // Ignore modem control lines
        _tio_config.c_cflag |= HUPCL;  // Enable hang-up on close

        // c_lflag - local modes
        // Leave all local mode flags unset. This enables noncanonical mode input.

        // c_cc - special characters
        // The following combination of VTIME and VMIN will result in a polling
        // read. If data is available a call to read() returns immediately. If
        // no data is available a call to read() returns 0.
        _tio_config.c_cc[VTIME] = 0;
        _tio_config.c_cc[VMIN] = 0;

        // Update configuration
        if ( 0 != ::cfsetspeed(&_tio_config, baud_rate) ) {
            ::perror("UartSerial::begin - Unable to set baud rate");
            if ( 0 != cleanupSerialFileDescriptor() ) {
                ::perror("UartSerial::begin - Unable to close serial file descriptor");
            }
        // Enable new term configuration
        } else if ( 0 != ::tcsetattr(_serial_file_descriptor, TCSANOW, &_tio_config) ) {
            ::perror("UartSerial::begin - Unable to set term attributes");
            if ( 0 != cleanupSerialFileDescriptor() ) {
                ::perror("UartSerial::begin - Unable to close serial file descriptor");
            }
        }
    }
}